

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O3

void __thiscall SHA256::update(SHA256 *this,uchar *message,uint len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = 0x40 - this->m_len;
  if (len <= uVar1) {
    uVar1 = len;
  }
  memcpy(this->m_block + this->m_len,message,(ulong)uVar1);
  uVar2 = this->m_len + len;
  if (0x3f < uVar2) {
    uVar3 = len - uVar1;
    transform(this,this->m_block,1);
    transform(this,message + uVar1,uVar3 >> 6);
    uVar2 = uVar3 & 0x3f;
    memcpy(this->m_block,message + uVar1 + (uVar3 & 0xffffffc0),(ulong)uVar2);
    this->m_tot_len = this->m_tot_len + (uVar3 & 0xffffffc0) + 0x40;
  }
  this->m_len = uVar2;
  return;
}

Assistant:

void SHA256::update(const unsigned char *message, unsigned int len)
{
    unsigned int block_nb;
    unsigned int new_len, rem_len, tmp_len;
    const unsigned char *shifted_message;
    tmp_len = SHA224_256_BLOCK_SIZE - m_len;
    rem_len = len < tmp_len ? len : tmp_len;
    memcpy(&m_block[m_len], message, rem_len);
    if (m_len + len < SHA224_256_BLOCK_SIZE) {
        m_len += len;
        return;
    }
    new_len = len - rem_len;
    block_nb = new_len / SHA224_256_BLOCK_SIZE;
    shifted_message = message + rem_len;
    transform(m_block, 1);
    transform(shifted_message, block_nb);
    rem_len = new_len % SHA224_256_BLOCK_SIZE;
    memcpy(m_block, &shifted_message[block_nb << 6], rem_len);
    m_len = rem_len;
    m_tot_len += (block_nb + 1) << 6;
}